

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O3

MPP_RET h264e_init(void *ctx,EncImplCfg *ctrl_cfg)

{
  H264eReorderInfo *reorder;
  H264eMarkingInfo *marking;
  int iVar1;
  long lVar2;
  long lVar3;
  MppEncRefs pvVar4;
  void *data;
  long lVar5;
  undefined4 uVar6;
  long lVar7;
  undefined4 uVar8;
  ulong uVar9;
  
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter\n","h264e_init");
  }
  *(MppClientType *)ctx = ctrl_cfg->type;
  *(undefined8 *)((long)ctx + 0x1878) = 0x400;
  data = mpp_osal_malloc("h264e_init",0x400);
  *(void **)((long)ctx + 0x1870) = data;
  if (data == (void *)0x0) {
    _mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_buf",
               "h264e_init",0xe0);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00233eb9;
    data = *(void **)((long)ctx + 0x1870);
  }
  mpp_packet_init((MppPacket *)((long)ctx + 0x1868),data,*(size_t *)((long)ctx + 0x1878));
  if (*(long *)((long)ctx + 0x1868) == 0) {
    _mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_pkt",
               "h264e_init",0xe2);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00233eb9:
      abort();
    }
  }
  pvVar4 = ctrl_cfg->refs;
  *(MppEncCfgSet **)((long)ctx + 8) = ctrl_cfg->cfg;
  *(MppEncRefs *)((long)ctx + 0x10) = pvVar4;
  *(undefined4 *)((long)ctx + 0x18) = 0;
  reorder = (H264eReorderInfo *)((long)ctx + 0x1650);
  h264e_reorder_init(reorder);
  marking = (H264eMarkingInfo *)((long)ctx + 0x175c);
  h264e_marking_init(marking);
  h264e_dpb_init((H264eDpb *)((long)ctx + 0x1a0),reorder,marking);
  h264e_slice_init((H264eSlice *)((long)ctx + 0x15c0),reorder,marking);
  lVar2 = *(long *)((long)ctx + 8);
  iVar1 = *ctx;
  memset((void *)(lVar2 + 0x348),0,0x90);
  *(undefined8 *)(lVar2 + 0x36c) = 0x1f00000042;
  *(undefined8 *)(lVar2 + 0x1864) = 0;
  *(undefined4 *)(lVar2 + 0x1894) = 0;
  if (iVar1 - 0x10U < 3) {
    uVar9 = (ulong)(iVar1 - 0x10U);
    lVar3 = *(long *)(&DAT_002b3e70 + uVar9 * 8);
    lVar5 = *(long *)(&DAT_002b3e88 + uVar9 * 8);
    uVar6 = *(undefined4 *)(&DAT_002b3ea0 + uVar9 * 4);
    lVar7 = *(long *)(&DAT_002b3eb0 + uVar9 * 8);
    uVar8 = *(undefined4 *)(&DAT_002b3ec8 + uVar9 * 4);
    *(undefined4 *)(lVar2 + *(long *)(&DAT_002b3e48 + uVar9 * 8)) =
         *(undefined4 *)(&DAT_002b3e60 + uVar9 * 4);
    *(undefined4 *)(lVar2 + lVar3) = 0xc;
  }
  else {
    lVar7 = 0x358;
    uVar6 = 0xc;
    lVar5 = 0x354;
    uVar8 = 0xc;
  }
  *(undefined4 *)(lVar2 + lVar5) = uVar6;
  *(undefined4 *)(lVar2 + lVar7) = uVar8;
  *(undefined4 *)(lVar2 + 0x364) = 0xc;
  *(undefined8 *)(lVar2 + 8) = 0x50000000000;
  *(undefined8 *)(lVar2 + 0x10) = 0x500000002d0;
  *(undefined4 *)(lVar2 + 0x18) = 0x2d0;
  *(undefined8 *)(lVar2 + 0x50) = 0;
  *(undefined8 *)(lVar2 + 0x24) = 0x200000000;
  *(undefined8 *)(lVar2 + 0x2c) = 0x200000002;
  *(undefined4 *)(lVar2 + 0x34) = 0;
  *(undefined4 *)(lVar2 + 0x90) = 0;
  *(undefined8 *)(lVar2 + 0x58) = 0;
  *(undefined8 *)(lVar2 + 0x60) = 0;
  *(undefined8 *)(lVar2 + 0x98) = 0x1e848000000002;
  *(undefined8 *)(lVar2 + 0xa0) = 0x16e360002625a0;
  *(undefined8 *)(lVar2 + 0xa8) = 0x1e00000000;
  *(undefined8 *)(lVar2 + 0xb0) = 1;
  *(undefined8 *)(lVar2 + 0xb8) = 0x10000001e;
  *(undefined4 *)(lVar2 + 0xc4) = 0x3c;
  *(undefined4 *)(lVar2 + 0xd4) = 1;
  *(undefined8 *)(lVar2 + 0x100) = 0xa0000001e;
  *(undefined8 *)(lVar2 + 0x108) = 0x1a000000a0;
  *(undefined8 *)(lVar2 + 0x110) = 0x30;
  *(undefined8 *)(lVar2 + 0x118) = 8;
  *(undefined4 *)(lVar2 + 0x124) = 2;
  *(undefined8 *)(lVar2 + 300) = 0x7fffffff7fffffff;
  *(undefined8 *)(lVar2 + 0x134) = 0x7fffffff7fffffff;
  *(undefined4 *)(lVar2 + 0x1884) = 1;
  *(undefined8 *)(lVar2 + 0x187c) = 0x100000001;
  *(undefined8 *)(lVar2 + 0x186c) = 0x100000003;
  *(undefined8 *)(lVar2 + 0x1874) = 0x600000006;
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave\n","h264e_init");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h264e_init(void *ctx, EncImplCfg *ctrl_cfg)
{
    MPP_RET ret = MPP_OK;
    H264eCtx *p = (H264eCtx *)ctx;

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("enter\n");

    p->type = ctrl_cfg->type;
    p->hdr_size = SZ_1K;
    p->hdr_buf = mpp_malloc_size(void, p->hdr_size);
    mpp_assert(p->hdr_buf);
    mpp_packet_init(&p->hdr_pkt, p->hdr_buf, p->hdr_size);
    mpp_assert(p->hdr_pkt);

    p->cfg = ctrl_cfg->cfg;
    p->refs = ctrl_cfg->refs;
    p->idr_request = 0;

    h264e_reorder_init(&p->reorder);
    h264e_marking_init(&p->marking);

    h264e_dpb_init(&p->dpb, &p->reorder, &p->marking);
    h264e_slice_init(&p->slice, &p->reorder, &p->marking);

    init_h264e_cfg_set(p->cfg, p->type);

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("leave\n");
    return ret;
}